

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O2

int __thiscall
GEO::geofile::import_mesh_spacing
          (geofile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *split_string_vector)

{
  bool bVar1;
  string *n;
  double dVar2;
  string msh_spc;
  
  boost::algorithm::erase_all<std::__cxx11::string,char[2]>
            ((split_string_vector->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 1,(char (*) [2])0x159059);
  n = (split_string_vector->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start + 1;
  bVar1 = is_e_notation(n);
  if (bVar1) {
    std::__cxx11::string::string((string *)&msh_spc,(string *)n);
    dVar2 = std::__cxx11::stod(&msh_spc,(size_t *)0x0);
    this->mesh_spacing = dVar2;
    std::__cxx11::string::~string((string *)&msh_spc);
  }
  return (uint)!bVar1;
}

Assistant:

int GEO::geofile::import_mesh_spacing(std::vector<std::string> &split_string_vector)
{
    boost::erase_all(split_string_vector[1], ";");
    if (is_e_notation(split_string_vector[1]))
    {
        std::string msh_spc = split_string_vector[1];
        mesh_spacing = std::stod(msh_spc);
        return EXIT_SUCCESS;
    }
    else
        return EXIT_FAILURE;
}